

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O0

void __thiscall LineModel::printLineParam(LineModel *this)

{
  ostream *poVar1;
  LineModel *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"best_model.A =  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->A_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  best_model.B =  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->B_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," best_model.C=  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->C_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printLineParam()
	{
		cout << "best_model.A =  "<< A_<< endl
			<<"  best_model.B =  " <<B_ <<endl
			<< " best_model.C=  "<<C_<< endl;
	}